

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O0

void __thiscall TextButton::TextButton(TextButton *this)

{
  function<void_(int)> *in_RDI;
  Vector2f *size;
  RectangleShape *in_stack_ffffffffffffffe0;
  Text *in_stack_fffffffffffffff0;
  
  UIComponent::UIComponent((UIComponent *)in_stack_ffffffffffffffe0);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__TextButton_002bc160;
  *(undefined ***)((long)&(in_RDI->super__Function_base)._M_functor + 8) = &PTR__TextButton_002bc198
  ;
  size = (Vector2f *)&in_RDI[5]._M_invoker;
  sf::Text::Text(in_stack_fffffffffffffff0);
  sf::Vector2<float>::Vector2((Vector2<float> *)&stack0xffffffffffffffe4,0.0,0.0);
  sf::RectangleShape::RectangleShape(in_stack_ffffffffffffffe0,size);
  sf::Color::Color((Color *)(in_RDI + 0x1c));
  sf::Color::Color((Color *)((long)&in_RDI[0x1c].super__Function_base._M_functor + 4));
  std::function<void_(int)>::function(in_RDI);
  return;
}

Assistant:

TextButton::TextButton() {}